

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_executor.cpp
# Opt level: O1

void __thiscall
duckdb::ExpressionExecutor::Initialize
          (ExpressionExecutor *this,Expression *expression,ExpressionExecutorState *state)

{
  _Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_> _Var1;
  _Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_> _Var2;
  _Head_base<0UL,_duckdb::ExpressionState_*,_false> in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ExpressionState_*,_false> local_18;
  
  state->executor = this;
  local_18._M_head_impl = in_RAX._M_head_impl;
  InitializeState((ExpressionExecutor *)&stack0xffffffffffffffe8,expression,state);
  _Var2.super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::ExpressionState_*,_false>)
       (_Head_base<0UL,_duckdb::ExpressionState_*,_false>)local_18._M_head_impl;
  local_18._M_head_impl = (ExpressionState *)0x0;
  _Var1.super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl =
       (state->root_state).
       super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
       .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>;
  (state->root_state).
  super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>.
  super__Head_base<0UL,_duckdb::ExpressionState_*,_false> =
       _Var2.super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl;
  if (_Var1.super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl !=
      (ExpressionState *)0x0) {
    (**(code **)(*(long *)_Var1.super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl
                + 8))();
  }
  if (local_18._M_head_impl != (ExpressionState *)0x0) {
    (**(code **)&((*(Expression **)local_18._M_head_impl)->super_BaseExpression).type)();
  }
  return;
}

Assistant:

void ExpressionExecutor::Initialize(const Expression &expression, ExpressionExecutorState &state) {
	state.executor = this;
	state.root_state = InitializeState(expression, state);
}